

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1.cpp
# Opt level: O0

int main(void)

{
  uint64_t uVar1;
  ostream *this;
  ulong local_28;
  uint64_t i;
  uint64_t n;
  uint64_t t;
  
  t._4_4_ = 0;
  std::istream::operator>>((istream *)&std::cin,&n);
  for (local_28 = 0; local_28 < n; local_28 = local_28 + 1) {
    std::istream::operator>>((istream *)&std::cin,&i);
    uVar1 = solve(i);
    this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar1);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int main() {
  uint64_t t, n;
  std::cin >> t;
  for (uint64_t i = 0; i < t; ++i) {
    std::cin >> n;
    std::cout << solve(n) << std::endl;
  }
  return 0;
}